

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChTriangleMeshConnected.cpp
# Opt level: O3

bool chrono::geometry::InterpolateAndInsert
               (ChTriangleMeshConnected *mesh,int ibuffer,int i1,int i2,int *created_index)

{
  undefined4 uVar1;
  undefined4 uVar2;
  undefined4 uVar4;
  undefined4 uVar5;
  undefined8 uVar3;
  pointer pCVar6;
  pointer pCVar7;
  pointer pCVar8;
  bool bVar9;
  bool bVar10;
  double dVar11;
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  int iVar15;
  ulong uVar16;
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  double dVar23;
  double dVar24;
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  ChVector<double> v;
  undefined1 local_28 [8];
  undefined8 uStack_20;
  double local_18;
  
  if (3 < (uint)ibuffer) {
    return false;
  }
  switch(ibuffer) {
  case 0:
    pCVar8 = (mesh->m_vertices).
             super__Vector_base<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    if (pCVar8 == (mesh->m_vertices).
                  super__Vector_base<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish) {
      return false;
    }
    auVar21._0_8_ = pCVar8[i1].m_data[0] + pCVar8[i2].m_data[0];
    auVar21._8_8_ = pCVar8[i1].m_data[1] + pCVar8[i2].m_data[1];
    auVar14._12_4_ = 0x3fe00000;
    auVar14._0_12_ = ZEXT812(0x3fe0000000000000);
    _local_28 = (double  [2])vmulpd_avx512vl(auVar21,auVar14);
    local_18 = (pCVar8[i1].m_data[2] + pCVar8[i2].m_data[2]) * 0.5;
    std::vector<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_>::push_back
              (&mesh->m_vertices,(value_type *)local_28);
    uVar16 = (long)(mesh->m_vertices).
                   super__Vector_base<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish -
             (long)(mesh->m_vertices).
                   super__Vector_base<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
    break;
  case 1:
    pCVar8 = (mesh->m_normals).
             super__Vector_base<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    uVar16 = 0;
    if (pCVar8 == (mesh->m_normals).
                  super__Vector_base<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish) {
      return false;
    }
    auVar22._0_8_ = pCVar8[i1].m_data[0] + pCVar8[i2].m_data[0];
    auVar22._8_8_ = pCVar8[i1].m_data[1] + pCVar8[i2].m_data[1];
    auVar13._12_4_ = 0x3fe00000;
    auVar13._0_12_ = ZEXT812(0x3fe0000000000000);
    auVar18 = vmulpd_avx512vl(auVar22,auVar13);
    dVar11 = (pCVar8[i1].m_data[2] + pCVar8[i2].m_data[2]) * 0.5;
    auVar25._0_8_ = auVar18._0_8_ * auVar18._0_8_;
    auVar25._8_8_ = auVar18._8_8_ * auVar18._8_8_;
    auVar17 = vshufpd_avx(auVar25,auVar25,1);
    auVar17 = vfmadd231sd_fma(auVar17,auVar18,auVar18);
    auVar20._8_8_ = 0;
    auVar20._0_8_ = dVar11;
    auVar17 = vfmadd231sd_fma(auVar17,auVar20,auVar20);
    auVar17 = vsqrtsd_avx(auVar17,auVar17);
    dVar23 = auVar17._0_8_;
    if (2.2250738585072014e-308 <= dVar23) {
      uVar16 = 0xff;
    }
    dVar24 = 1.0 / dVar23;
    auVar26._8_8_ = dVar24;
    auVar26._0_8_ = dVar24;
    auVar17 = vmulpd_avx512vl(auVar18,auVar26);
    bVar9 = (bool)((byte)uVar16 & 1);
    bVar10 = (bool)((byte)(uVar16 >> 1) & 1);
    local_18 = (double)((ulong)(2.2250738585072014e-308 <= dVar23) * (long)(dVar11 * dVar24));
    uStack_20 = (double)((ulong)bVar10 * auVar17._8_8_ | (ulong)!bVar10 * 0x3ff0000000000000);
    local_28 = (undefined1  [8])((ulong)bVar9 * auVar17._0_8_ | (ulong)!bVar9 * 0x3ff0000000000000);
    std::vector<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_>::push_back
              (&mesh->m_normals,(value_type *)local_28);
    uVar16 = (long)(mesh->m_normals).
                   super__Vector_base<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish -
             (long)(mesh->m_normals).
                   super__Vector_base<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
    break;
  case 2:
    pCVar6 = (mesh->m_UV).
             super__Vector_base<chrono::ChVector2<double>,_std::allocator<chrono::ChVector2<double>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    if (pCVar6 != (mesh->m_UV).
                  super__Vector_base<chrono::ChVector2<double>,_std::allocator<chrono::ChVector2<double>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish) {
      auVar19._0_8_ = pCVar6[i1].m_data[0] + pCVar6[i2].m_data[0];
      auVar19._8_8_ = pCVar6[i1].m_data[1] + pCVar6[i2].m_data[1];
      auVar12._12_4_ = 0x3fe00000;
      auVar12._0_12_ = ZEXT812(0x3fe0000000000000);
      _local_28 = (double  [2])vmulpd_avx512vl(auVar19,auVar12);
      std::vector<chrono::ChVector2<double>,_std::allocator<chrono::ChVector2<double>_>_>::push_back
                (&mesh->m_UV,(value_type *)local_28);
      *created_index =
           (int)((ulong)((long)(mesh->m_UV).
                               super__Vector_base<chrono::ChVector2<double>,_std::allocator<chrono::ChVector2<double>_>_>
                               ._M_impl.super__Vector_impl_data._M_finish -
                        (long)(mesh->m_UV).
                              super__Vector_base<chrono::ChVector2<double>,_std::allocator<chrono::ChVector2<double>_>_>
                              ._M_impl.super__Vector_impl_data._M_start) >> 4) + -1;
      return true;
    }
    return false;
  case 3:
    pCVar7 = (mesh->m_colors).super__Vector_base<chrono::ChColor,_std::allocator<chrono::ChColor>_>.
             _M_impl.super__Vector_impl_data._M_start;
    if (pCVar7 == (mesh->m_colors).
                  super__Vector_base<chrono::ChColor,_std::allocator<chrono::ChColor>_>._M_impl.
                  super__Vector_impl_data._M_finish) {
      return false;
    }
    uVar1 = pCVar7[i1].R;
    uVar4 = pCVar7[i1].G;
    uVar2 = pCVar7[i2].R;
    uVar5 = pCVar7[i2].G;
    auVar18._0_4_ = (float)uVar1 + (float)uVar2;
    auVar18._4_4_ = (float)uVar4 + (float)uVar5;
    auVar18._8_8_ = 0;
    auVar17._8_4_ = 0x3f000000;
    auVar17._0_8_ = 0x3f0000003f000000;
    auVar17._12_4_ = 0x3f000000;
    auVar17 = vmulps_avx512vl(auVar18,auVar17);
    uVar3 = vmovlps_avx(auVar17);
    uStack_20._4_4_ = local_28._4_4_;
    uStack_20._0_4_ = (pCVar7[i1].B + pCVar7[i2].B) * 0.5;
    local_28 = (undefined1  [8])uVar3;
    std::vector<chrono::ChColor,_std::allocator<chrono::ChColor>_>::push_back
              (&mesh->m_colors,(value_type *)local_28);
    iVar15 = (int)((ulong)((long)(mesh->m_colors).
                                 super__Vector_base<chrono::ChColor,_std::allocator<chrono::ChColor>_>
                                 ._M_impl.super__Vector_impl_data._M_finish -
                          (long)(mesh->m_colors).
                                super__Vector_base<chrono::ChColor,_std::allocator<chrono::ChColor>_>
                                ._M_impl.super__Vector_impl_data._M_start) >> 2);
    goto LAB_0080a6bd;
  }
  iVar15 = (int)(uVar16 >> 3);
LAB_0080a6bd:
  *created_index = iVar15 * -0x55555555 + -1;
  return true;
}

Assistant:

bool InterpolateAndInsert(ChTriangleMeshConnected& mesh, int ibuffer, int i1, int i2, int& created_index) {
    switch (ibuffer) {
        case 0: {
            if (mesh.m_vertices.empty())
                return false;
            ChVector<> Vnew = (mesh.m_vertices[i1] + mesh.m_vertices[i2]) * 0.5;
            mesh.m_vertices.push_back(Vnew);
            created_index = (int)mesh.m_vertices.size() - 1;
            return true;
        }
        case 1: {
            if (mesh.m_normals.empty())
                return false;
            ChVector<> Vnew = (mesh.m_normals[i1] + mesh.m_normals[i2]) * 0.5;
            Vnew.Normalize();
            mesh.m_normals.push_back(Vnew);
            created_index = (int)mesh.m_normals.size() - 1;
            return true;
        }
        case 2: {
            if (mesh.m_UV.empty())
                return false;
            ChVector2<> Vnew = (mesh.m_UV[i1] + mesh.m_UV[i2]) * 0.5;
            mesh.m_UV.push_back(Vnew);
            created_index = (int)mesh.m_UV.size() - 1;
            return true;
        }
        case 3: {
            if (mesh.m_colors.empty())
                return false;
            ChColor Vnew = {(mesh.m_colors[i1].R + mesh.m_colors[i2].R) * 0.5f,
                            (mesh.m_colors[i1].G + mesh.m_colors[i2].G) * 0.5f,
                            (mesh.m_colors[i1].B + mesh.m_colors[i2].B) * 0.5f};
            mesh.m_colors.push_back(Vnew);
            created_index = (int)mesh.m_colors.size() - 1;
            return true;
        }
        default:
            return false;
    }
}